

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

boolean get_mon_location(monst *mon,xchar *xp,xchar *yp,int locflags)

{
  xchar xVar1;
  
  if (mon == &youmonst) {
    *xp = u.ux;
    xVar1 = u.uy;
  }
  else {
    if ((mon->mx < '\x01') || ((locflags == 0 && ((*(uint *)&mon->field_0x60 & 0x200) != 0)))) {
      *yp = '\0';
      *xp = '\0';
      return '\0';
    }
    *xp = mon->mx;
    xVar1 = mon->my;
  }
  *yp = xVar1;
  return '\x01';
}

Assistant:

boolean get_mon_location(struct monst *mon, xchar *xp, xchar *yp, int locflags)
{
	if (mon == &youmonst) {
	    *xp = u.ux;
	    *yp = u.uy;
	    return TRUE;
	} else if (mon->mx > 0 && (!mon->mburied || locflags)) {
	    *xp = mon->mx;
	    *yp = mon->my;
	    return TRUE;
	} else {	/* migrating or buried */
	    *xp = *yp = 0;
	    return FALSE;
	}
}